

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O0

QString * __thiscall QFileSystemEntry::baseName(QFileSystemEntry *this)

{
  long in_RSI;
  QString *in_RDI;
  int length;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar1;
  long position;
  QString *this_00;
  
  position = in_RSI;
  this_00 = in_RDI;
  findFileNameSeparators
            ((QFileSystemEntry *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  iVar1 = -1;
  if ((-1 < *(short *)(in_RSI + 0x32)) &&
     (iVar1 = (int)*(short *)(in_RSI + 0x32), *(short *)(in_RSI + 0x30) != -1)) {
    iVar1 = iVar1 + -1;
  }
  QString::mid(this_00,position,CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  return in_RDI;
}

Assistant:

QString QFileSystemEntry::baseName() const
{
    findFileNameSeparators();
    int length = -1;
    if (m_firstDotInFileName >= 0) {
        length = m_firstDotInFileName;
        if (m_lastSeparator != -1) // avoid off by one
            length--;
    }
#if defined(Q_OS_WIN)
    if (m_lastSeparator == -1 && m_filePath.length() >= 2 && m_filePath.at(1) == u':')
        return m_filePath.mid(2, length - 2);
#endif
    return m_filePath.mid(m_lastSeparator + 1, length);
}